

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints.cc
# Opt level: O1

bool __thiscall
bssl::NameConstraints::IsPermittedDirectoryName(NameConstraints *this,Input name_rdn_sequence)

{
  Span<const_unsigned_char> *pSVar1;
  bool bVar2;
  Input *permitted_name;
  Span<const_unsigned_char> *pSVar3;
  bool bVar4;
  
  pSVar3 = &((this->excluded_subtrees_).directory_names.
             super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
             super__Vector_impl_data._M_start)->data_;
  pSVar1 = &((this->excluded_subtrees_).directory_names.
             super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
             super__Vector_impl_data._M_finish)->data_;
  bVar4 = pSVar3 == pSVar1;
  if (!bVar4) {
    bVar2 = VerifyNameInSubtree(name_rdn_sequence,(Input)*pSVar3);
    while (!bVar2) {
      pSVar3 = pSVar3 + 1;
      bVar4 = pSVar3 == pSVar1;
      if (bVar4) goto LAB_004aecff;
      bVar2 = VerifyNameInSubtree(name_rdn_sequence,(Input)*pSVar3);
    }
    if (!bVar4) {
      return false;
    }
  }
LAB_004aecff:
  if (((this->permitted_subtrees_).present_name_types & 0x10) == 0) {
    return true;
  }
  pSVar3 = &((this->permitted_subtrees_).directory_names.
             super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
             super__Vector_impl_data._M_start)->data_;
  pSVar1 = &((this->permitted_subtrees_).directory_names.
             super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
             super__Vector_impl_data._M_finish)->data_;
  if (pSVar3 != pSVar1) {
    bVar4 = false;
    do {
      bVar2 = VerifyNameInSubtree(name_rdn_sequence,(Input)*pSVar3);
      bVar4 = (bool)(bVar4 | bVar2);
      if (bVar2) {
        return bVar4;
      }
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != pSVar1);
  }
  return false;
}

Assistant:

bool NameConstraints::IsPermittedDirectoryName(
    der::Input name_rdn_sequence) const {
  for (const auto &excluded_name : excluded_subtrees_.directory_names) {
    if (VerifyNameInSubtree(name_rdn_sequence, excluded_name)) {
      return false;
    }
  }

  // If permitted subtrees are not constrained, any name that is not excluded is
  // allowed.
  if (!(permitted_subtrees_.present_name_types & GENERAL_NAME_DIRECTORY_NAME)) {
    return true;
  }

  for (const auto &permitted_name : permitted_subtrees_.directory_names) {
    if (VerifyNameInSubtree(name_rdn_sequence, permitted_name)) {
      return true;
    }
  }

  return false;
}